

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeIndex
          (BinaryReaderObjdumpDisassemble *this,Index value)

{
  Enum EVar1;
  ObjdumpState *pOVar2;
  key_type in_RAX;
  size_t sVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  string_view sVar7;
  key_type local_28;
  
  if (this->in_function_body != true) {
    return (Result)Ok;
  }
  EVar1 = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
  local_28 = in_RAX;
  if ((int)EVar1 < 0x1c) {
    if (1 < EVar1 - LocalGet) {
      if (EVar1 == Throw) {
        sVar7 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->tag_names
                                  ,value);
        sVar3 = sVar7._M_len;
      }
      else {
        if (EVar1 != Call) goto LAB_00113f34;
        sVar7 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                                   function_names,value);
        sVar3 = sVar7._M_len;
      }
      goto joined_r0x00113ec1;
    }
  }
  else {
    if (1 < EVar1 - GlobalGet) goto LAB_00113f34;
    sVar7 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->global_names,
                              value);
    sVar3 = sVar7._M_len;
joined_r0x00113ec1:
    if (sVar3 != 0) {
      p_Var6 = (_Base_ptr)sVar7._M_str;
      p_Var5 = (_Base_ptr)(ulong)(uint)sVar7._M_len;
      goto LAB_00113f2b;
    }
    if (1 < EVar1 - LocalGet) goto LAB_00113f34;
  }
  pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  local_28.second = value;
  local_28.first = this->current_function_index;
  cVar4 = std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&pOVar2->local_names,&local_28);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &(pOVar2->local_names).names._M_t._M_impl.super__Rb_tree_header) {
    p_Var6 = (_Base_ptr)0x0;
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var6 = cVar4._M_node[1]._M_parent;
    p_Var5 = cVar4._M_node[1]._M_left;
  }
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_00113f34:
    LogOpcode(this,"%d",value);
    return (Result)Ok;
  }
LAB_00113f2b:
  LogOpcode(this,"%d <%.*s>",value,p_Var5,p_Var6);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeIndex(Index value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  std::string_view name;
  if (current_opcode == Opcode::Call &&
      !(name = GetFunctionName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if (current_opcode == Opcode::Throw &&
             !(name = GetTagName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::GlobalGet ||
              current_opcode == Opcode::GlobalSet) &&
             !(name = GetGlobalName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::LocalGet ||
              current_opcode == Opcode::LocalSet) &&
             !(name = GetLocalName(current_function_index, value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%d", value);
  }
  return Result::Ok;
}